

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O1

int Fra_ClausSelectClauses(Clu_Man_t *p)

{
  size_t __size;
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int *__s;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  
  iVar1 = p->nClausesMax;
  if (p->vClauses->nSize <= iVar1) {
    __assert_fail("Vec_IntSize(p->vClauses) > p->nClausesMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClaus.c"
                  ,0x161,"int Fra_ClausSelectClauses(Clu_Man_t *)");
  }
  iVar6 = p->nSimWords;
  uVar8 = (long)iVar6 << 5;
  __size = (long)iVar6 * 0x80 + 4;
  __s = (int *)malloc(__size);
  memset(__s,0,__size);
  pVVar4 = p->vCosts;
  iVar2 = pVVar4->nSize;
  uVar7 = (uint)uVar8;
  if (0 < (long)iVar2) {
    piVar5 = pVVar4->pArray;
    lVar10 = 0;
    do {
      iVar3 = piVar5[lVar10];
      if ((long)iVar3 != -1) {
        if ((int)uVar7 < iVar3) {
          __assert_fail("Cost < CostMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClaus.c"
                        ,0x16a,"int Fra_ClausSelectClauses(Clu_Man_t *)");
        }
        __s[iVar3] = __s[iVar3] + 1;
      }
      lVar10 = lVar10 + 1;
    } while (iVar2 != lVar10);
  }
  if (*__s == 0) {
    uVar12 = uVar7;
    if (0 < iVar6) {
      uVar9 = 1;
      if ((int)uVar7 < 1) {
        uVar9 = uVar7;
      }
      iVar6 = 0;
      uVar8 = uVar8 & 0xffffffff;
      do {
        uVar11 = (uint)uVar8;
        if (__s[uVar8] < 0) {
          __assert_fail("pCostCount[c] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClaus.c"
                        ,0x172,"int Fra_ClausSelectClauses(Clu_Man_t *)");
        }
        iVar6 = iVar6 + __s[uVar8];
        uVar12 = uVar11;
      } while ((iVar6 < iVar1) && (uVar8 = (ulong)(uVar11 - 1), uVar12 = uVar9 - 1, 1 < (int)uVar11)
              );
    }
    if (pVVar4->nSize < 1) {
      uVar9 = 0;
    }
    else {
      piVar5 = pVVar4->pArray;
      lVar10 = 0;
      uVar9 = 0;
      do {
        if ((piVar5[lVar10] < (int)uVar12) || (p->nClausesMax <= (int)uVar9)) {
          piVar5[lVar10] = -1;
        }
        else {
          uVar9 = uVar9 + 1;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < pVVar4->nSize);
    }
    free(__s);
    p->nClauses = uVar9;
    if (p->fVerbose != 0) {
      printf("Selected %d clauses. Cost range: [%d < %d < %d]\n",(ulong)uVar9,1,(ulong)uVar12,
             (ulong)(uVar7 + 1));
    }
    return uVar12;
  }
  __assert_fail("pCostCount[0] == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClaus.c"
                ,0x16d,"int Fra_ClausSelectClauses(Clu_Man_t *)");
}

Assistant:

int Fra_ClausSelectClauses( Clu_Man_t * p )
{
    int * pCostCount, nClauCount, Cost, CostMax, i, c;
    assert( Vec_IntSize(p->vClauses) > p->nClausesMax );   
    // count how many implications have each cost
    CostMax = p->nSimWords * 32 + 1;
    pCostCount = ABC_ALLOC( int, CostMax );
    memset( pCostCount, 0, sizeof(int) * CostMax );
    Vec_IntForEachEntry( p->vCosts, Cost, i )
    {
        if ( Cost == -1 )
            continue;
        assert( Cost < CostMax );
        pCostCount[ Cost ]++;
    }
    assert( pCostCount[0] == 0 );
    // select the bound on the cost (above this bound, implication will be included)
    nClauCount = 0;
    for ( c = CostMax - 1; c > 0; c-- )
    {
        assert( pCostCount[c] >= 0 );
        nClauCount += pCostCount[c];
        if ( nClauCount >= p->nClausesMax )
            break;
    }
    // collect implications with the given costs
    nClauCount = 0;
    Vec_IntForEachEntry( p->vCosts, Cost, i )
    {
        if ( Cost >= c && nClauCount < p->nClausesMax )
        {
            nClauCount++;
            continue;
        }
        Vec_IntWriteEntry( p->vCosts, i, -1 );
    }
    ABC_FREE( pCostCount );
    p->nClauses = nClauCount;
if ( p->fVerbose )
printf( "Selected %d clauses. Cost range: [%d < %d < %d]\n", nClauCount, 1, c, CostMax );
    return c;
}